

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_tools.cpp
# Opt level: O2

R_conflict1 scanPrefix(char *p,char *stop,int base)

{
  char cVar1;
  undefined4 in_register_00000014;
  bool bVar3;
  R_conflict1 RVar4;
  R_conflict1 RVar5;
  ulong uStack_8;
  ulong uVar2;
  
  uVar2 = CONCAT44(in_register_00000014,base);
  if ((stop <= p) || (9 < (int)*p - 0x30U)) goto LAB_0011dd01;
  if (*p == '0') {
    if (p + 1 < stop) {
      cVar1 = p[1];
      if (cVar1 != 'B') {
        if ((cVar1 == 'X') || (cVar1 == 'x')) {
          uVar2 = (ulong)(uint)base;
          if (base == 0) {
            uVar2 = 0x10;
          }
          bVar3 = (int)uVar2 == 0x10;
          goto LAB_0011dd0f;
        }
        if (cVar1 != 'b') goto LAB_0011dcf9;
      }
      uVar2 = (ulong)(uint)base;
      if (base == 0) {
        uVar2 = 2;
      }
      bVar3 = (int)uVar2 == 2;
LAB_0011dd0f:
      RVar5._8_8_ = uVar2;
      RVar5.next = p + (ulong)bVar3 * 2;
      return RVar5;
    }
LAB_0011dcf9:
    uStack_8 = 8;
  }
  else {
    uStack_8 = 10;
  }
  uVar2 = (ulong)(uint)base;
  if (base == 0) {
    uVar2 = uStack_8;
  }
LAB_0011dd01:
  RVar4._8_8_ = uVar2;
  RVar4.next = p;
  return RVar4;
}

Assistant:

static auto scanPrefix(const char *p, const char *stop, int base)
{
    struct R
    {
        const char *next;
        int base;
    };
    if (p < stop && isAsciiDigit(*p)) {
        if (*p == '0') {
            const char *x_or_b = p + 1;
            if (x_or_b < stop) {
                switch (*x_or_b) {
                case 'b':
                case 'B':
                    if (base == 0)
                        base = 2;
                    if (base == 2)
                        p += 2;
                    return R{p, base};
                case 'x':
                case 'X':
                    if (base == 0)
                        base = 16;
                    if (base == 16)
                        p += 2;
                    return R{p, base};
                }
            }
            if (base == 0)
                base = 8;
        } else if (base == 0) {
            base = 10;
        }
        Q_ASSERT(base);
    }
    return R{p, base};
}